

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

stumpless_target * stumpless_set_default_facility(stumpless_target *target,int default_facility)

{
  int iVar1;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else {
    iVar1 = facility_is_invalid(default_facility);
    if (iVar1 == 0) {
      lock_target(target);
      iVar1 = get_severity(target->default_prival);
      target->default_prival = iVar1 + default_facility;
      unlock_target(target);
      clear_error();
      return target;
    }
    raise_invalid_facility(default_facility);
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_set_default_facility( struct stumpless_target *target,
                                int default_facility ) {
  int old_severity;

  VALIDATE_ARG_NOT_NULL( target );

  if( facility_is_invalid( default_facility ) ) {
    raise_invalid_facility( default_facility );
    return NULL;
  }

  lock_target( target );
  old_severity = get_severity( target->default_prival );
  target->default_prival = default_facility + old_severity;
  unlock_target( target );

  clear_error(  );
  return target;
}